

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O1

void asio::detail::thread_info_base::
     deallocate<asio::detail::thread_info_base::executor_function_tag>
               (long param_1,undefined1 *param_2,ulong param_3)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  if (param_1 != 0 && param_3 < 0x3fd) {
    if (*(long *)(param_1 + 0x20) == 0) {
      *param_2 = param_2[param_3];
      *(undefined1 **)(param_1 + 0x20) = param_2;
    }
    else {
      uVar3 = 3;
      do {
        if (uVar3 == 4) goto LAB_00185b0b;
        uVar1 = uVar3 + 1;
        lVar2 = uVar3 * 8;
        uVar3 = uVar1;
      } while (*(long *)(param_1 + 0x10 + lVar2) != 0);
      *param_2 = param_2[param_3];
      *(undefined1 **)(param_1 + 8 + uVar1 * 8) = param_2;
      if (4 < uVar1) goto LAB_00185b0b;
    }
    return;
  }
LAB_00185b0b:
  operator_delete(param_2);
  return;
}

Assistant:

static void deallocate(Purpose, thread_info_base* this_thread,
      void* pointer, std::size_t size)
  {
    if (size <= chunk_size * UCHAR_MAX)
    {
      if (this_thread)
      {
        for (int mem_index = Purpose::begin_mem_index;
            mem_index < Purpose::end_mem_index; ++mem_index)
        {
          if (this_thread->reusable_memory_[mem_index] == 0)
          {
            unsigned char* const mem = static_cast<unsigned char*>(pointer);
            mem[0] = mem[size];
            this_thread->reusable_memory_[mem_index] = pointer;
            return;
          }
        }
      }
    }

    aligned_delete(pointer);
  }